

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdLoad.c
# Opt level: O0

void Load_Init(Abc_Frame_t *pAbc)

{
  int iVar1;
  Vec_Ptr_t *p;
  char *__s1;
  char *pcVar2;
  int local_2c;
  int i;
  char *pStop;
  char *pName;
  Vec_Ptr_t *vFileNames;
  Abc_Frame_t *pAbc_local;
  
  p = CmdCollectFileNames();
  if (p != (Vec_Ptr_t *)0x0) {
    for (local_2c = 0; iVar1 = Vec_PtrSize(p), local_2c < iVar1; local_2c = local_2c + 1) {
      __s1 = (char *)Vec_PtrEntry(p,local_2c);
      iVar1 = strncmp(__s1,"abccmd_",7);
      if (iVar1 == 0) {
        pcVar2 = strstr(__s1 + 7,".");
        if (pcVar2 != (char *)0x0) {
          *pcVar2 = '\0';
        }
        Cmd_CommandAdd(pAbc,"ZZ",__s1 + 7,CmdCommandLoad,0);
      }
    }
    Vec_PtrFreeFree(p);
  }
  return;
}

Assistant:

void Load_Init( Abc_Frame_t * pAbc )
{
    Vec_Ptr_t * vFileNames;
    char * pName, * pStop;
    int i;
    vFileNames = CmdCollectFileNames();
    if ( vFileNames == NULL )
        return;
    Vec_PtrForEachEntry( char *, vFileNames, pName, i )
    {
        if ( strncmp( pName, "abccmd_", 7 ) )
            continue;
        // get the command name
//        pName[6] = '!';
        pStop = strstr( pName + 7, "." );
        if ( pStop )
            *pStop = 0;
        // add the command
        Cmd_CommandAdd( pAbc, "ZZ", pName+7, CmdCommandLoad, 0 );
//        printf( "Loaded command \"%s\"\n", pName+7 );
    }
    Vec_PtrFreeFree( vFileNames );
}